

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O2

SAttribute * __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::getAttributeByName
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this,char *name)

{
  long lVar1;
  bool bVar2;
  SAttribute *pSVar3;
  long lVar4;
  long lVar5;
  string<char> n;
  
  if (name == (char *)0x0) {
    pSVar3 = (SAttribute *)0x0;
  }
  else {
    core::string<char>::string<char>(&n,name);
    lVar5 = -1;
    pSVar3 = (SAttribute *)0x0;
    lVar1 = -0x20;
    do {
      lVar4 = lVar1;
      lVar5 = lVar5 + 1;
      if ((int)(this->Attributes).used <= lVar5) goto LAB_0061a32b;
      bVar2 = core::string<char>::operator==
                        ((string<char> *)((long)&(this->Attributes).data[1].Name.array + lVar4),&n);
      lVar1 = lVar4 + 0x20;
    } while (!bVar2);
    pSVar3 = (SAttribute *)((long)&(this->Attributes).data[1].Name.array + lVar4);
LAB_0061a32b:
    core::string<char>::~string(&n);
  }
  return pSVar3;
}

Assistant:

const SAttribute* getAttributeByName(const char_type* name) const
	{
		if (!name)
			return 0;

		core::string<char_type> n = name;

		for (int i=0; i<(int)Attributes.size(); ++i)
			if (Attributes[i].Name == n)
				return &Attributes[i];

		return 0;
	}